

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O0

stmm_table * stmm_copy(stmm_table *old_table)

{
  int iVar1;
  stmm_table_entry **ppsVar2;
  Extra_MmFixed_t *pEVar3;
  stmm_table_entry *psVar4;
  int local_34;
  int num_bins;
  int i;
  stmm_table_entry *newEntry;
  stmm_table_entry *ptr;
  stmm_table *newEntry_table;
  stmm_table *old_table_local;
  
  iVar1 = old_table->num_bins;
  old_table_local = (stmm_table *)malloc(0x38);
  if (old_table_local == (stmm_table *)0x0) {
    old_table_local = (stmm_table *)0x0;
  }
  else {
    memcpy(old_table_local,old_table,0x38);
    ppsVar2 = (stmm_table_entry **)malloc((long)iVar1 << 3);
    old_table_local->bins = ppsVar2;
    if (old_table_local->bins == (stmm_table_entry **)0x0) {
      if (old_table_local != (stmm_table *)0x0) {
        free(old_table_local);
      }
      old_table_local = (stmm_table *)0x0;
    }
    else {
      pEVar3 = Extra_MmFixedStart(0x18);
      old_table_local->pMemMan = pEVar3;
      for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
        old_table_local->bins[local_34] = (stmm_table_entry *)0x0;
        for (newEntry = old_table->bins[local_34]; newEntry != (stmm_table_entry *)0x0;
            newEntry = newEntry->next) {
          psVar4 = (stmm_table_entry *)
                   Extra_MmFixedEntryFetch((Extra_MmFixed_t *)old_table_local->pMemMan);
          if (psVar4 == (stmm_table_entry *)0x0) {
            Extra_MmFixedStop((Extra_MmFixed_t *)old_table_local->pMemMan);
            if (old_table_local->bins != (stmm_table_entry **)0x0) {
              free(old_table_local->bins);
              old_table_local->bins = (stmm_table_entry **)0x0;
            }
            if (old_table_local != (stmm_table *)0x0) {
              free(old_table_local);
            }
            return (stmm_table *)0x0;
          }
          psVar4->key = newEntry->key;
          psVar4->record = newEntry->record;
          psVar4->next = newEntry->next;
          psVar4->next = old_table_local->bins[local_34];
          old_table_local->bins[local_34] = psVar4;
        }
      }
    }
  }
  return old_table_local;
}

Assistant:

stmm_table *
stmm_copy (stmm_table *old_table)
{
    stmm_table *newEntry_table;
    stmm_table_entry *ptr, /* *newEntryptr, *next, */ *newEntry;
    int i, /*j, */ num_bins = old_table->num_bins;

    newEntry_table = ABC_ALLOC(stmm_table, 1);
    if (newEntry_table == NULL) {
    return NULL;
    }

    *newEntry_table = *old_table;
    newEntry_table->bins = ABC_ALLOC(stmm_table_entry *, num_bins);
    if (newEntry_table->bins == NULL) {
    ABC_FREE(newEntry_table);
    return NULL;
    }

    // allocate the memory manager for the newEntry table
    newEntry_table->pMemMan = Extra_MmFixedStart (sizeof (stmm_table_entry));

    for (i = 0; i < num_bins; i++) {
    newEntry_table->bins[i] = NULL;
    ptr = old_table->bins[i];
    while (ptr != NULL) {
//                      newEntry = ABC_ALLOC( stmm_table_entry, 1 );
        newEntry = (stmm_table_entry *)Extra_MmFixedEntryFetch ((Extra_MmFixed_t *)newEntry_table->pMemMan);
        if (newEntry == NULL) {
/*
                for ( j = 0; j <= i; j++ )
                {
                    newEntryptr = newEntry_table->bins[j];
                    while ( newEntryptr != NULL )
                    {
                        next = newEntryptr->next;
                        ABC_FREE( newEntryptr );
                        newEntryptr = next;
                    }
                }
*/
        Extra_MmFixedStop ((Extra_MmFixed_t *)newEntry_table->pMemMan);

        ABC_FREE(newEntry_table->bins);
        ABC_FREE(newEntry_table);
        return NULL;
        }
        *newEntry = *ptr;
        newEntry->next = newEntry_table->bins[i];
        newEntry_table->bins[i] = newEntry;
        ptr = ptr->next;
    }
    }
    return newEntry_table;
}